

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeUpdateLoop<signed_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UnifiedVectorFormat *in_RCX;
  char *update_vector_data;
  char *base_table_data;
  row_t *in_stack_00002928;
  char *in_stack_00002930;
  SelectionVector *in_stack_00002938;
  UpdateInfo *in_stack_00002940;
  char *in_stack_00002948;
  UpdateInfo *in_stack_00002950;
  idx_t in_stack_00002960;
  SelectionVector *in_stack_00002968;
  
  FlatVector::GetData<signed_char>((Vector *)0xbc42e1);
  UnifiedVectorFormat::GetData<signed_char>(in_RCX);
  MergeUpdateLoopInternal<signed_char,signed_char,duckdb::ExtractStandardEntry>
            (in_stack_00002950,in_stack_00002948,in_stack_00002940,in_stack_00002938,
             in_stack_00002930,in_stack_00002928,in_stack_00002960,in_stack_00002968);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}